

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnBrOnExn(SharedValidator *this,Location *loc,Var *depth,Var *event_var)

{
  Result rhs;
  char *pcVar1;
  int __c;
  Var local_98;
  Enum local_4c;
  undefined1 local_48 [8];
  EventType event_type;
  Var *event_var_local;
  Var *depth_local;
  Location *loc_local;
  SharedValidator *this_local;
  Result result;
  
  event_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)event_var;
  Result::Result((Result *)((long)&this_local + 4),Ok);
  this->expr_loc_ = loc;
  EventType::EventType((EventType *)local_48);
  Var::Var(&local_98,event_var);
  local_4c = (Enum)CheckEventIndex(this,&local_98,(EventType *)local_48);
  pcVar1 = (char *)(ulong)local_4c;
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_4c);
  Var::~Var(&local_98);
  pcVar1 = Var::index(depth,pcVar1,__c);
  rhs = TypeChecker::OnBrOnExn(&this->typechecker_,(Index)pcVar1,(TypeVector *)local_48);
  Result::operator|=((Result *)((long)&this_local + 4),rhs);
  EventType::~EventType((EventType *)local_48);
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnBrOnExn(const Location& loc,
                                  Var depth,
                                  Var event_var) {
  Result result = Result::Ok;
  expr_loc_ = &loc;
  EventType event_type;
  result |= CheckEventIndex(event_var, &event_type);
  result |= typechecker_.OnBrOnExn(depth.index(), event_type.params);
  return result;
}